

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

bool getFunctionNameAndStartLineForAddress
               (DWARFCompileUnit *CU,uint64_t Address,FunctionNameKind Kind,string *FunctionName,
               uint32_t *StartLine)

{
  bool bVar1;
  reference this;
  char *pcVar2;
  uint64_t uVar3;
  uint64_t DeclLineResult;
  char *Name;
  bool FoundResult;
  DWARFDie *DIE;
  undefined1 local_88 [8];
  SmallVector<llvm::DWARFDie,_4U> InlinedChain;
  uint32_t *StartLine_local;
  string *FunctionName_local;
  FunctionNameKind Kind_local;
  uint64_t Address_local;
  DWARFCompileUnit *CU_local;
  
  InlinedChain.super_SmallVectorStorage<llvm::DWARFDie,_4U>.InlineElts[3].buffer._8_8_ = StartLine;
  llvm::SmallVector<llvm::DWARFDie,_4U>::SmallVector((SmallVector<llvm::DWARFDie,_4U> *)local_88);
  llvm::DWARFUnit::getInlinedChainForAddress
            (&CU->super_DWARFUnit,Address,(SmallVectorImpl<llvm::DWARFDie> *)local_88);
  bVar1 = llvm::SmallVectorBase::empty((SmallVectorBase *)local_88);
  if (bVar1) {
    CU_local._7_1_ = false;
  }
  else {
    this = llvm::SmallVectorTemplateCommon<llvm::DWARFDie,_void>::operator[]
                     ((SmallVectorTemplateCommon<llvm::DWARFDie,_void> *)local_88,0);
    Name._7_1_ = false;
    if (Kind != None) {
      pcVar2 = llvm::DWARFDie::getSubroutineName(this,Kind);
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::operator=((string *)FunctionName,pcVar2);
        Name._7_1_ = true;
      }
    }
    uVar3 = llvm::DWARFDie::getDeclLine(this);
    if (uVar3 != 0) {
      *(int *)InlinedChain.super_SmallVectorStorage<llvm::DWARFDie,_4U>.InlineElts[3].buffer._8_8_ =
           (int)uVar3;
      Name._7_1_ = true;
    }
    CU_local._7_1_ = Name._7_1_;
  }
  llvm::SmallVector<llvm::DWARFDie,_4U>::~SmallVector((SmallVector<llvm::DWARFDie,_4U> *)local_88);
  return CU_local._7_1_;
}

Assistant:

static bool getFunctionNameAndStartLineForAddress(DWARFCompileUnit *CU,
                                                  uint64_t Address,
                                                  FunctionNameKind Kind,
                                                  std::string &FunctionName,
                                                  uint32_t &StartLine) {
  // The address may correspond to instruction in some inlined function,
  // so we have to build the chain of inlined functions and take the
  // name of the topmost function in it.
  SmallVector<DWARFDie, 4> InlinedChain;
  CU->getInlinedChainForAddress(Address, InlinedChain);
  if (InlinedChain.empty())
    return false;

  const DWARFDie &DIE = InlinedChain[0];
  bool FoundResult = false;
  const char *Name = nullptr;
  if (Kind != FunctionNameKind::None && (Name = DIE.getSubroutineName(Kind))) {
    FunctionName = Name;
    FoundResult = true;
  }
  if (auto DeclLineResult = DIE.getDeclLine()) {
    StartLine = DeclLineResult;
    FoundResult = true;
  }

  return FoundResult;
}